

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

void __thiscall TempData::writeLine(TempData *this,int64_t memoryAddress,string *text)

{
  bool bVar1;
  string *fmt;
  int *in_R8;
  string str;
  string local_58;
  char hexbuf [10];
  
  bVar1 = TextFile::isOpen(&this->file);
  if (bVar1) {
    hexbuf[8] = '\0';
    hexbuf[9] = '\0';
    hexbuf[0] = '\0';
    hexbuf[1] = '\0';
    hexbuf[2] = '\0';
    hexbuf[3] = '\0';
    hexbuf[4] = '\0';
    hexbuf[5] = '\0';
    hexbuf[6] = '\0';
    hexbuf[7] = '\0';
    snprintf(hexbuf,10,"%08X ",memoryAddress & 0xffffffff);
    std::operator+(&str,hexbuf,text);
    while (str._M_string_length < 0x46) {
      std::__cxx11::string::push_back((char)&str);
    }
    fmt = FileList::string_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
    tinyformat::format<std::__cxx11::string,int>
              (&local_58,(tinyformat *)"; %S line %d",(char *)fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &Global.FileInfo.LineNumber,in_R8);
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::~string((string *)&local_58);
    TextFile::writeLine(&this->file,&str);
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void TempData::writeLine(int64_t memoryAddress, const std::string& text)
{
	if (file.isOpen())
	{
		char hexbuf[10] = {0};
		snprintf(hexbuf, 10, "%08X ", (int32_t) memoryAddress);
		std::string str = hexbuf + text;
		while (str.size() < 70)
			str += ' ';

		str += tfm::format("; %S line %d",
			Global.fileList.string(Global.FileInfo.FileNum),Global.FileInfo.LineNumber);

		file.writeLine(str);
	}
}